

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GB.cpp
# Opt level: O2

void __thiscall OpenMD::GB::calcForce(GB *this,InteractionData *idat)

{
  Vector3d *v1;
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined8 uVar9;
  pointer piVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  double __x;
  double dVar20;
  double dVar21;
  double dVar23;
  undefined1 auVar22 [16];
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  undefined1 auVar34 [16];
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double dVar41;
  undefined8 local_2f8;
  Vector3d ul2;
  Vector3d ul1;
  Vector<double,_3U> local_120;
  Vector<double,_3U> local_108;
  Vector<double,_3U> local_f0;
  Vector<double,_3U> local_d8;
  Vector3d rxu1;
  Vector3d rhat;
  Vector3d uxu;
  Vector3d rxu2;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar10 = (this->GBtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar11 = *(long *)&(this->MixingMap).
                     super__Vector_base<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>,_std::allocator<std::vector<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[piVar10[idat->atid1]].
                     super__Vector_base<OpenMD::GBInteractionData,_std::allocator<OpenMD::GBInteractionData>_>
                     ._M_impl.super__Vector_impl_data;
  lVar16 = (long)piVar10[idat->atid2] * 0x50;
  lVar1 = lVar16 + lVar11;
  dVar21 = *(double *)(lVar11 + lVar16);
  dVar30 = *(double *)(lVar11 + 8 + lVar16);
  dVar41 = *(double *)(lVar11 + 0x10 + lVar16);
  dVar2 = *(double *)(lVar11 + 0x18 + lVar16);
  dVar3 = *(double *)(lVar11 + 0x20 + lVar16);
  dVar4 = *(double *)(lVar11 + 0x28 + lVar16);
  dVar5 = *(double *)(lVar11 + 0x30 + lVar16);
  dVar6 = *(double *)(lVar11 + 0x38 + lVar16);
  dVar7 = *(double *)(lVar11 + 0x40 + lVar16);
  RectMatrix<double,_3U,_3U>::getRow
            (&ul2.super_Vector<double,_3U>,(RectMatrix<double,_3U,_3U> *)&idat->A1,2);
  Vector<double,_3U>::Vector(&ul1.super_Vector<double,_3U>,&ul2.super_Vector<double,_3U>);
  RectMatrix<double,_3U,_3U>::getRow
            (&rhat.super_Vector<double,_3U>,(RectMatrix<double,_3U,_3U> *)&idat->A2,2);
  Vector<double,_3U>::Vector(&ul2.super_Vector<double,_3U>,&rhat.super_Vector<double,_3U>);
  if (*(char *)(lVar11 + 0x48 + lVar16) == '\x01') {
    Vector<double,_3U>::operator=
              (&ul1.super_Vector<double,_3U>,(Vector<double,_3U> *)OpenMD::V3Zero);
    uVar17 = 0;
    uVar18 = 0;
  }
  else {
    dVar24 = dot<double,3u>(&(idat->d).super_Vector<double,_3U>,&ul1.super_Vector<double,_3U>);
    uVar17 = SUB84(dVar24,0);
    uVar18 = (undefined4)((ulong)dVar24 >> 0x20);
  }
  local_2f8 = CONCAT44(uVar18,uVar17);
  if (*(char *)(lVar1 + 0x49) == '\x01') {
    Vector<double,_3U>::operator=
              (&ul2.super_Vector<double,_3U>,(Vector<double,_3U> *)OpenMD::V3Zero);
    dVar24 = 0.0;
  }
  else {
    dVar24 = dot<double,3u>(&(idat->d).super_Vector<double,_3U>,&ul2.super_Vector<double,_3U>);
  }
  dVar36 = 0.0;
  if ((*(char *)(lVar1 + 0x48) == '\0') && (*(char *)(lVar1 + 0x49) == '\0')) {
    dVar36 = dot<double,3u>(&ul1.super_Vector<double,_3U>,&ul2.super_Vector<double,_3U>);
  }
  uVar9 = idat->rij;
  auVar40._8_8_ = local_2f8;
  auVar40._0_8_ = dVar24;
  auVar34._8_4_ = (int)uVar9;
  auVar34._0_8_ = uVar9;
  auVar34._12_4_ = (int)((ulong)uVar9 >> 0x20);
  auVar34 = divpd(auVar40,auVar34);
  dVar35 = auVar34._8_8_;
  dVar31 = auVar34._0_8_;
  dVar19 = 1.0 - dVar36 * dVar36 * dVar5;
  dVar23 = 1.0 - dVar36 * dVar36 * dVar2;
  dVar38 = (dVar2 * -2.0 * dVar35 * dVar31 * dVar36 +
           dVar3 * dVar35 * dVar35 + dVar4 * dVar31 * dVar31) / dVar23;
  dVar24 = 1.0 - dVar38;
  if (dVar24 < 0.0) {
    dVar24 = sqrt(dVar24);
  }
  else {
    dVar24 = SQRT(dVar24);
  }
  dVar37 = (dVar5 * -2.0 * dVar35 * dVar31 * dVar36 +
           dVar35 * dVar35 * dVar6 + dVar31 * dVar31 * dVar7) / dVar19;
  dVar24 = dVar21 / dVar24;
  if (dVar23 < 0.0) {
    dVar12 = sqrt(dVar23);
  }
  else {
    dVar12 = SQRT(dVar23);
  }
  __x = 1.0 - dVar37;
  dVar12 = pow(1.0 / dVar12,this->nu_);
  dVar27 = pow(__x,this->mu_);
  dVar27 = dVar27 * dVar30 * dVar12;
  dVar30 = idat->rij;
  dVar12 = idat->vdwMult;
  dVar28 = (dVar21 * dVar41) / ((dVar30 - dVar24) + dVar21 * dVar41);
  dVar20 = dVar28 * dVar28 * dVar28;
  dVar20 = dVar20 * dVar20;
  dVar29 = dVar20 * dVar20 - dVar20;
  dVar32 = dVar12 * 4.0 * dVar27 * dVar29;
  dVar33 = this->mu_;
  dVar8 = this->nu_;
  v1 = &idat->d;
  operator/(&rxu1.super_Vector<double,_3U>,&v1->super_Vector<double,_3U>,dVar30);
  Vector<double,_3U>::Vector(&rhat.super_Vector<double,_3U>,&rxu1.super_Vector<double,_3U>);
  cross<double>(&rxu1,v1,&ul1);
  cross<double>(&rxu2,v1,&ul2);
  cross<double>(&uxu,&ul1,&ul2);
  dVar13 = idat->sw * dVar32;
  (idat->pot).data_[1] = (idat->pot).data_[1] + dVar13;
  if (idat->isSelected == true) {
    (idat->selePot).data_[1] = dVar13 + (idat->selePot).data_[1];
  }
  auVar22._0_8_ =
       (dVar5 * dVar35 * dVar31 - dVar5 * dVar37 * dVar36) * dVar29 * dVar33 * dVar27 * 8.0;
  auVar22._8_8_ = dVar36 * dVar2 * dVar29 * dVar8 * dVar27 * 4.0;
  auVar15._8_8_ = dVar23;
  auVar15._0_8_ = dVar19;
  auVar34 = divpd(auVar22,auVar15);
  dVar28 = dVar28 * dVar20;
  dVar19 = (dVar12 * -8.0 * dVar27 * dVar33 * dVar29) / (__x * dVar30);
  dVar24 = dVar24 * dVar24 * dVar24;
  dVar33 = dVar21 * dVar21 * dVar21;
  dVar23 = ((dVar27 * 8.0 * dVar24 * (dVar28 * 3.0 + dVar20 * dVar28 * -6.0) *
            (dVar2 * dVar35 * dVar31 - dVar2 * dVar38 * dVar36)) / dVar23) / (dVar41 * dVar33) +
           auVar34._8_8_ + auVar34._0_8_ / __x;
  auVar39._0_8_ = dVar30 * dVar21 * dVar21;
  auVar39._8_8_ = (dVar20 * dVar28 * 6.0 + dVar28 * -3.0) * dVar12 * 8.0 * dVar27 * dVar24;
  auVar14._8_8_ = dVar33 * dVar41 * dVar30;
  auVar14._0_8_ = dVar24;
  auVar40 = divpd(auVar39,auVar14);
  dVar41 = auVar40._8_8_;
  auVar25._0_8_ = (dVar7 * dVar31 - dVar5 * dVar35 * dVar36) * dVar19;
  auVar25._8_8_ = (dVar4 * dVar31 - dVar2 * dVar35 * dVar36) * dVar41;
  auVar34 = divpd(auVar25,auVar15);
  dVar30 = auVar34._8_8_ + auVar34._0_8_;
  auVar26._0_8_ = (dVar6 * dVar35 + dVar36 * -dVar5 * dVar31) * dVar19;
  auVar26._8_8_ = (dVar3 * dVar35 + dVar36 * -dVar2 * dVar31) * dVar41;
  auVar34 = divpd(auVar26,auVar15);
  dVar21 = auVar34._8_8_ + auVar34._0_8_;
  operator*(&local_120,-(dVar19 * dVar37 + (auVar40._0_8_ + dVar38) * dVar41),
            &rhat.super_Vector<double,_3U>);
  operator*(&local_48,dVar21,&ul1.super_Vector<double,_3U>);
  OpenMD::operator+(&local_108,&local_120,&local_48);
  operator*(&local_60,dVar30,&ul2.super_Vector<double,_3U>);
  OpenMD::operator+(&local_f0,&local_108,&local_60);
  operator*(&local_d8,&local_f0,idat->sw);
  Vector<double,_3U>::add(&(idat->f1).super_Vector<double,_3U>,&local_d8);
  operator*(&local_108,dVar21,&rxu1.super_Vector<double,_3U>);
  operator*(&local_120,dVar23,&uxu.super_Vector<double,_3U>);
  operator-(&local_f0,&local_108,&local_120);
  operator*(&local_d8,&local_f0,idat->sw);
  Vector<double,_3U>::add(&(idat->t1).super_Vector<double,_3U>,&local_d8);
  operator*(&local_108,dVar30,&rxu2.super_Vector<double,_3U>);
  operator*(&local_120,dVar23,&uxu.super_Vector<double,_3U>);
  OpenMD::operator+(&local_f0,&local_108,&local_120);
  operator*(&local_d8,&local_f0,idat->sw);
  Vector<double,_3U>::add(&(idat->t2).super_Vector<double,_3U>,&local_d8);
  idat->vpair = dVar32 + idat->vpair;
  return;
}

Assistant:

void GB::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    GBInteractionData& mixer =
        MixingMap[GBtids[idat.atid1]][GBtids[idat.atid2]];

    RealType sigma0 = mixer.sigma0;
    RealType dw     = mixer.dw;
    RealType eps0   = mixer.eps0;
    RealType x2     = mixer.x2;
    RealType xa2    = mixer.xa2;
    RealType xai2   = mixer.xai2;
    RealType xp2    = mixer.xp2;
    RealType xpap2  = mixer.xpap2;
    RealType xpapi2 = mixer.xpapi2;

    Vector3d ul1 = idat.A1.getRow(2);
    Vector3d ul2 = idat.A2.getRow(2);

    RealType a, b, g;

    if (mixer.i_is_LJ) {
      a   = 0.0;
      ul1 = V3Zero;
    } else {
      a = dot(idat.d, ul1);
    }

    if (mixer.j_is_LJ) {
      b   = 0.0;
      ul2 = V3Zero;
    } else {
      b = dot(idat.d, ul2);
    }

    if (mixer.i_is_LJ || mixer.j_is_LJ)
      g = 0.0;
    else
      g = dot(ul1, ul2);

    RealType au = a / idat.rij;
    RealType bu = b / idat.rij;

    RealType au2 = au * au;
    RealType bu2 = bu * bu;
    RealType g2  = g * g;

    RealType H =
        (xa2 * au2 + xai2 * bu2 - 2.0 * x2 * au * bu * g) / (1.0 - x2 * g2);
    RealType Hp = (xpap2 * au2 + xpapi2 * bu2 - 2.0 * xp2 * au * bu * g) /
                  (1.0 - xp2 * g2);

    RealType sigma = sigma0 / sqrt(1.0 - H);
    RealType e1    = 1.0 / sqrt(1.0 - x2 * g2);
    RealType e2    = 1.0 - Hp;
    RealType eps   = eps0 * pow(e1, nu_) * pow(e2, mu_);
    RealType BigR  = dw * sigma0 / (idat.rij - sigma + dw * sigma0);

    RealType R3  = BigR * BigR * BigR;
    RealType R6  = R3 * R3;
    RealType R7  = R6 * BigR;
    RealType R12 = R6 * R6;
    RealType R13 = R6 * R7;

    RealType U = idat.vdwMult * 4.0 * eps * (R12 - R6);

    RealType s3  = sigma * sigma * sigma;
    RealType s03 = sigma0 * sigma0 * sigma0;

    RealType pref1 =
        -idat.vdwMult * 8.0 * eps * mu_ * (R12 - R6) / (e2 * idat.rij);

    RealType pref2 = idat.vdwMult * 8.0 * eps * s3 * (6.0 * R13 - 3.0 * R7) /
                     (dw * idat.rij * s03);

    RealType dUdr =
        -(pref1 * Hp + pref2 * (sigma0 * sigma0 * idat.rij / s3 + H));

    RealType dUda = pref1 * (xpap2 * au - xp2 * bu * g) / (1.0 - xp2 * g2) +
                    pref2 * (xa2 * au - x2 * bu * g) / (1.0 - x2 * g2);

    RealType dUdb = pref1 * (xpapi2 * bu - xp2 * au * g) / (1.0 - xp2 * g2) +
                    pref2 * (xai2 * bu - x2 * au * g) / (1.0 - x2 * g2);

    RealType dUdg = 4.0 * eps * nu_ * (R12 - R6) * x2 * g / (1.0 - x2 * g2) +
                    8.0 * eps * mu_ * (R12 - R6) *
                        (xp2 * au * bu - Hp * xp2 * g) / (1.0 - xp2 * g2) / e2 +
                    8.0 * eps * s3 * (3.0 * R7 - 6.0 * R13) *
                        (x2 * au * bu - H * x2 * g) / (1.0 - x2 * g2) /
                        (dw * s03);

    Vector3d rhat = idat.d / idat.rij;
    Vector3d rxu1 = cross(idat.d, ul1);
    Vector3d rxu2 = cross(idat.d, ul2);
    Vector3d uxu  = cross(ul1, ul2);

    idat.pot[VANDERWAALS_FAMILY] += U * idat.sw;
    if (idat.isSelected) idat.selePot[VANDERWAALS_FAMILY] += U * idat.sw;

    idat.f1 += (dUdr * rhat + dUda * ul1 + dUdb * ul2) * idat.sw;
    idat.t1 += (dUda * rxu1 - dUdg * uxu) * idat.sw;
    idat.t2 += (dUdb * rxu2 + dUdg * uxu) * idat.sw;
    idat.vpair += U;
    return;
  }